

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_image.cpp
# Opt level: O1

void load_image_block(astcenc_profile decode_mode,astcenc_image *img,image_block *blk,
                     block_size_descriptor *bsd,uint xpos,uint ypos,uint zpos,astcenc_swizzle *swz)

{
  uint uVar1;
  void *pvVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined8 uVar9;
  uint uVar10;
  code *pcVar11;
  code *pcVar12;
  uint uVar13;
  code *pcVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  bool bVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 extraout_var [56];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined8 local_118;
  undefined1 local_88 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  
  uVar1 = img->dim_x;
  uVar15 = img->dim_y;
  uVar17 = img->dim_z;
  blk->xpos = xpos;
  blk->ypos = ypos;
  blk->zpos = zpos;
  pcVar14 = swz_texel;
  if ((swz->a == ASTCENC_SWZ_A && swz->b == ASTCENC_SWZ_B) &&
      (swz->g == ASTCENC_SWZ_G && swz->r == ASTCENC_SWZ_R)) {
    pcVar14 = swz_texel_skip;
  }
  auVar32 = vpinsrd_avx(ZEXT416(decode_mode & ~ASTCENC_PRF_LDR),decode_mode,1);
  auVar32 = vpcmpeqd_avx(auVar32,_DAT_0032d1d0);
  auVar5 = vpshufd_avx(auVar32,0x40);
  pcVar11 = load_texel_u8;
  if (img->data_type == ASTCENC_TYPE_F32) {
    pcVar11 = load_texel_f32;
  }
  pcVar12 = load_texel_f16;
  if (img->data_type != ASTCENC_TYPE_F16) {
    pcVar12 = pcVar11;
  }
  pcVar11 = encode_texel_lns;
  if ((((auVar5 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar5 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar5 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar5[0xf]) {
    pcVar11 = encode_texel_unorm;
  }
  local_88 = ZEXT816(0);
  if (bsd->zdim == '\0') {
    auVar21._8_4_ = 0x7e967699;
    auVar21._0_8_ = 0x7e9676997e967699;
    auVar21._12_4_ = 0x7e967699;
    auVar37._8_4_ = 0xfe967699;
    auVar37._0_8_ = 0xfe967699fe967699;
    auVar37._12_4_ = 0xfe967699;
    bVar19 = true;
    auVar24 = ZEXT816(0);
  }
  else {
    fVar23 = 1.0 / (float)bsd->texel_count;
    auVar37 = vpmovsxdq_avx(auVar32);
    auVar22 = ZEXT1664(auVar37);
    uVar9 = vpextrq_avx(auVar37,1);
    uVar17 = uVar17 - 1;
    uVar15 = uVar15 - 1;
    uVar13 = uVar1 - 1;
    auVar37 = vpcmpeqd_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
    auVar28 = ZEXT1664(auVar37);
    auVar38 = ZEXT1664(CONCAT412(0xfe967699,CONCAT48(0xfe967699,0xfe967699fe967699)));
    auVar40 = ZEXT864(0);
    auVar39 = ZEXT1664(CONCAT412(0x7e967699,CONCAT48(0x7e967699,0x7e9676997e967699)));
    iVar18 = 0;
    uVar8 = 0;
    do {
      uVar7 = zpos + uVar8;
      if (uVar17 <= zpos + uVar8) {
        uVar7 = uVar17;
      }
      if (bsd->ydim != '\0') {
        pvVar2 = img->data[uVar7];
        uVar7 = 0;
        do {
          if (bsd->xdim != '\0') {
            uVar6 = ypos + uVar7;
            if (uVar15 <= ypos + uVar7) {
              uVar6 = uVar15;
            }
            lVar16 = 0;
            do {
              uVar10 = xpos + (int)lVar16;
              if (uVar13 <= uVar10) {
                uVar10 = uVar13;
              }
              (*pcVar12)(pvVar2,(uVar10 + uVar6 * uVar1) * 4);
              uVar20 = (*pcVar14)(swz);
              local_118 = auVar5._0_8_;
              auVar22._0_8_ = (*pcVar11)(uVar20,local_118);
              auVar22._8_56_ = extraout_var;
              local_68 = auVar40._0_4_;
              fStack_64 = auVar40._4_4_;
              fStack_60 = auVar40._8_4_;
              fStack_5c = auVar40._12_4_;
              auVar21 = auVar22._0_16_;
              auVar37 = vminps_avx(auVar39._0_16_,auVar21);
              auVar39 = ZEXT1664(auVar37);
              fVar3 = (float)auVar22._0_8_;
              auVar40 = ZEXT1664(CONCAT412(fStack_5c + fVar23 * extraout_var._4_4_,
                                           CONCAT48(fStack_60 + fVar23 * extraout_var._0_4_,
                                                    CONCAT44(fStack_64 +
                                                             fVar23 * (float)((ulong)auVar22._0_8_
                                                                             >> 0x20),
                                                             local_68 + fVar23 * fVar3))));
              auVar37 = vmaxps_avx(auVar38._0_16_,auVar21);
              auVar38 = ZEXT1664(auVar37);
              auVar24._4_4_ = fVar3;
              auVar24._0_4_ = fVar3;
              auVar24._8_4_ = fVar3;
              auVar24._12_4_ = fVar3;
              auVar37 = vshufps_avx(auVar21,auVar21,0xa5);
              auVar37 = vcmpps_avx(auVar24,auVar37,0);
              blk->data_r[iVar18 + lVar16] = fVar3;
              fVar3 = (float)vextractps_avx(auVar21,1);
              blk->data_g[iVar18 + lVar16] = fVar3;
              auVar37 = vandps_avx(auVar37,auVar28._0_16_);
              auVar28 = ZEXT1664(auVar37);
              fVar3 = (float)vextractps_avx(auVar21,2);
              blk->data_b[iVar18 + lVar16] = fVar3;
              fVar3 = (float)vextractps_avx(auVar21,3);
              blk->data_a[iVar18 + lVar16] = fVar3;
              blk->rgb_lns[lVar16 + iVar18] = auVar32[0] & 1;
              blk->alpha_lns[lVar16 + iVar18] = (byte)uVar9 & 1;
              lVar16 = lVar16 + 1;
            } while ((uint)lVar16 < (uint)bsd->xdim);
            iVar18 = iVar18 + (uint)lVar16;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < bsd->ydim);
      }
      auVar37 = auVar38._0_16_;
      auVar24 = auVar40._0_16_;
      auVar21 = auVar39._0_16_;
      uVar8 = uVar8 + 1;
    } while (uVar8 < bsd->zdim);
    auVar4 = vpcmpeqd_avx(auVar22._0_16_,auVar22._0_16_);
    auVar4 = auVar4 & ~auVar28._0_16_;
    bVar19 = (((auVar4 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar4 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar4 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar4[0xf];
  }
  auVar4 = vinsertps_avx(*(undefined1 (*) [16])blk->data_r,ZEXT416((uint)blk->data_g[0]),0x10);
  auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)blk->data_b[0]),0x20);
  auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)blk->data_a[0]),0x30);
  if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    auVar25._0_4_ = (int)auVar4._0_4_;
    auVar25._4_4_ = (int)auVar4._4_4_;
    auVar25._8_4_ = (int)auVar4._8_4_;
    auVar25._12_4_ = (int)auVar4._12_4_;
    auVar32._8_4_ = 0x7ff;
    auVar32._0_8_ = 0x7ff000007ff;
    auVar32._12_4_ = 0x7ff;
    auVar26 = vpand_avx(auVar25,auVar32);
    auVar29._8_4_ = 3;
    auVar29._0_8_ = 0x300000003;
    auVar29._12_4_ = 3;
    auVar27 = vpmaddwd_avx(auVar26,auVar29);
    auVar31._8_4_ = 0x1ff;
    auVar31._0_8_ = 0x1ff000001ff;
    auVar31._12_4_ = 0x1ff;
    auVar29 = vpcmpgtd_avx(auVar26,auVar31);
    auVar32 = vpslld_avx(auVar26,2);
    auVar33._8_4_ = 0xfffffe00;
    auVar33._0_8_ = 0xfffffe00fffffe00;
    auVar33._12_4_ = 0xfffffe00;
    auVar34._8_4_ = 0x5ff;
    auVar34._0_8_ = 0x5ff000005ff;
    auVar34._12_4_ = 0x5ff;
    auVar32 = vpaddd_avx(auVar32,auVar33);
    auVar30 = vpcmpgtd_avx(auVar26,auVar34);
    auVar35._8_2_ = 5;
    auVar35._0_8_ = 0x5000500050005;
    auVar35._10_2_ = 5;
    auVar35._12_2_ = 5;
    auVar35._14_2_ = 5;
    auVar26 = vpmaddwd_avx(auVar26,auVar35);
    auVar36._8_4_ = 0xfffff800;
    auVar36._0_8_ = 0xfffff800fffff800;
    auVar36._12_4_ = 0xfffff800;
    auVar26 = vpaddd_avx(auVar26,auVar36);
    auVar32 = vblendvps_avx(auVar32,auVar26,auVar30);
    auVar32 = vblendvps_avx(auVar27,auVar32,auVar29);
    auVar26 = vpsrld_avx(auVar25,1);
    auVar30._8_4_ = 0x7ffffc00;
    auVar30._0_8_ = 0x7ffffc007ffffc00;
    auVar30._12_4_ = 0x7ffffc00;
    auVar29 = vpsrld_avx(auVar32,3);
    auVar32 = vpand_avx(auVar26,auVar30);
    auVar26._8_4_ = 0x7bff;
    auVar26._0_8_ = 0x7bff00007bff;
    auVar26._12_4_ = 0x7bff;
    auVar32 = vpor_avx(auVar29,auVar32);
    auVar32 = vpminsd_avx(auVar32,auVar26);
    auVar32 = vpackssdw_avx(auVar32,auVar32);
    local_88 = vcvtph2ps_f16c(auVar32);
  }
  auVar27._8_4_ = 0x477fff00;
  auVar27._0_8_ = 0x477fff00477fff00;
  auVar27._12_4_ = 0x477fff00;
  auVar32 = vdivps_avx(auVar4,auVar27);
  auVar32 = vblendvps_avx(auVar32,local_88,auVar5);
  *(undefined1 (*) [16])(blk->origin_texel).m = auVar32;
  *(undefined1 (*) [16])(blk->data_min).m = auVar21;
  *(undefined1 (*) [16])(blk->data_mean).m = auVar24;
  *(undefined1 (*) [16])(blk->data_max).m = auVar37;
  blk->grayscale = bVar19;
  return;
}

Assistant:

void load_image_block(
	astcenc_profile decode_mode,
	const astcenc_image& img,
	image_block& blk,
	const block_size_descriptor& bsd,
	unsigned int xpos,
	unsigned int ypos,
	unsigned int zpos,
	const astcenc_swizzle& swz
) {
	unsigned int xsize = img.dim_x;
	unsigned int ysize = img.dim_y;
	unsigned int zsize = img.dim_z;

	blk.xpos = xpos;
	blk.ypos = ypos;
	blk.zpos = zpos;

	// True if any non-identity swizzle
	bool needs_swz = (swz.r != ASTCENC_SWZ_R) || (swz.g != ASTCENC_SWZ_G) ||
	                 (swz.b != ASTCENC_SWZ_B) || (swz.a != ASTCENC_SWZ_A);

	int idx = 0;

	vfloat4 data_min(1e38f);
	vfloat4 data_mean(0.0f);
	vfloat4 data_mean_scale(1.0f / static_cast<float>(bsd.texel_count));
	vfloat4 data_max(-1e38f);
	vmask4 grayscalev(true);

	// This works because we impose the same choice everywhere during encode
	uint8_t rgb_lns = (decode_mode == ASTCENC_PRF_HDR) ||
	                  (decode_mode == ASTCENC_PRF_HDR_RGB_LDR_A) ? 1 : 0;
	uint8_t a_lns = decode_mode == ASTCENC_PRF_HDR ? 1 : 0;
	vint4 use_lns(rgb_lns, rgb_lns, rgb_lns, a_lns);
	vmask4 lns_mask = use_lns != vint4::zero();

	// Set up the function pointers for loading pipeline as needed
	pixel_loader loader = load_texel_u8;
	if (img.data_type == ASTCENC_TYPE_F16)
	{
		loader = load_texel_f16;
	}
	else if  (img.data_type == ASTCENC_TYPE_F32)
	{
		loader = load_texel_f32;
	}

	pixel_swizzler swizzler = swz_texel_skip;
	if (needs_swz)
	{
		swizzler = swz_texel;
	}

	pixel_converter converter = encode_texel_unorm;
	if (any(lns_mask))
	{
		converter = encode_texel_lns;
	}

	for (unsigned int z = 0; z < bsd.zdim; z++)
	{
		unsigned int zi = astc::min(zpos + z, zsize - 1);
		void* plane = img.data[zi];

		for (unsigned int y = 0; y < bsd.ydim; y++)
		{
			unsigned int yi = astc::min(ypos + y, ysize - 1);

			for (unsigned int x = 0; x < bsd.xdim; x++)
			{
				unsigned int xi = astc::min(xpos + x, xsize - 1);

				vfloat4 datav = loader(plane, (4 * xsize * yi) + (4 * xi));
				datav = swizzler(datav, swz);
				datav = converter(datav, lns_mask);

				// Compute block metadata
				data_min = min(data_min, datav);
				data_mean += datav * data_mean_scale;
				data_max = max(data_max, datav);

				grayscalev = grayscalev & (datav.swz<0,0,0,0>() == datav.swz<1,1,2,2>());

				blk.data_r[idx] = datav.lane<0>();
				blk.data_g[idx] = datav.lane<1>();
				blk.data_b[idx] = datav.lane<2>();
				blk.data_a[idx] = datav.lane<3>();

				blk.rgb_lns[idx] = rgb_lns;
				blk.alpha_lns[idx] = a_lns;

				idx++;
			}
		}
	}

	// Reverse the encoding so we store origin block in the original format
	vfloat4 data_enc = blk.texel(0);
	vfloat4 data_enc_unorm = data_enc / 65535.0f;
	vfloat4 data_enc_lns = vfloat4::zero();

	if (rgb_lns || a_lns)
	{
		data_enc_lns = float16_to_float(lns_to_sf16(float_to_int(data_enc)));
	}

	blk.origin_texel = select(data_enc_unorm, data_enc_lns, lns_mask);

	// Store block metadata
	blk.data_min = data_min;
	blk.data_mean = data_mean;
	blk.data_max = data_max;
	blk.grayscale = all(grayscalev);
}